

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::initialiseSolve(HEkkDual *this)

{
  HEkk *pHVar1;
  HighsOptions *pHVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  
  pHVar1 = this->ekk_instance_;
  pHVar2 = pHVar1->options_;
  this->objective_bound = (pHVar2->super_HighsOptionsStruct).objective_bound;
  dVar3 = (pHVar2->super_HighsOptionsStruct).primal_feasibility_tolerance;
  dVar4 = (pHVar2->super_HighsOptionsStruct).dual_feasibility_tolerance;
  this->dual_feasibility_tolerance = dVar4;
  this->Tp = dVar3;
  this->primal_feasibility_tolerance = dVar3;
  this->Td = dVar4;
  this->initial_basis_is_logical_ = true;
  if (0 < (long)this->solver_num_row) {
    lVar5 = 0;
    do {
      if ((pHVar1->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] < this->solver_num_col) {
        this->initial_basis_is_logical_ = false;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (this->solver_num_row != lVar5);
  }
  interpretDualEdgeWeightStrategy(this,(pHVar1->info_).dual_edge_weight_strategy);
  pHVar1 = this->ekk_instance_;
  pHVar1->model_status_ = kMin;
  pHVar1->solve_bailout_ = false;
  pHVar1->called_return_from_solve_ = false;
  pHVar1->exit_algorithm_ = kDual;
  this->rebuild_reason = 0;
  return;
}

Assistant:

void HEkkDual::initialiseSolve() {
  // Copy values of simplex solver options to dual simplex options
  primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  dual_feasibility_tolerance =
      ekk_instance_.options_->dual_feasibility_tolerance;
  objective_bound = ekk_instance_.options_->objective_bound;

  // Copy tolerances
  // ToDo: Eliminate these horribly-named unnecessary copies!
  Tp = primal_feasibility_tolerance;
  Td = dual_feasibility_tolerance;

  initial_basis_is_logical_ = true;
  for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
    if (ekk_instance_.basis_.basicIndex_[iRow] < solver_num_col) {
      initial_basis_is_logical_ = false;
      break;
    }
  }

  interpretDualEdgeWeightStrategy(
      ekk_instance_.info_.dual_edge_weight_strategy);

  // Initialise model and run status values
  ekk_instance_.model_status_ = HighsModelStatus::kNotset;
  ekk_instance_.solve_bailout_ = false;
  ekk_instance_.called_return_from_solve_ = false;
  ekk_instance_.exit_algorithm_ = SimplexAlgorithm::kDual;

  rebuild_reason = kRebuildReasonNo;
}